

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::checkAreaNumLines
          (LineRenderCase *this,ConstPixelBufferAccess *access,IVec4 *area,int *messageLimitCounter,
          int componentNdx,IVec2 *numLines)

{
  ostringstream *poVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int z;
  int y;
  ConstPixelBufferAccess subAccess;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar9 = 0;
  tcu::getSubregion(&subAccess,access,area->m_data[0],area->m_data[1],0,area->m_data[2],
                    area->m_data[3],1);
  if (0 < subAccess.m_size.m_data[1]) {
    iVar8 = 0;
    iVar5 = -1;
    z = 0;
    iVar9 = 0;
    iVar6 = subAccess.m_size.m_data[1];
    iVar7 = subAccess.m_size.m_data[0];
    do {
      if (0 < iVar7) {
        y = 0;
        iVar4 = iVar5;
        do {
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_1b0,(int)&subAccess,y,z);
          iVar5 = *(int *)(local_1b0 + (long)componentNdx * 4);
          if (iVar4 != -1) {
            iVar6 = 1;
            if (iVar5 == iVar4 || iVar5 < iVar4) {
              iVar6 = -(uint)(iVar5 < iVar4);
            }
            if (((iVar5 != iVar4) && (iVar6 == -iVar8)) || ((iVar5 != iVar4 && (iVar8 == 0)))) {
              iVar8 = -(uint)(iVar5 < iVar4);
              if (iVar4 < iVar5) {
                iVar8 = 1;
              }
              iVar9 = iVar9 + (uint)(iVar5 <= iVar4);
            }
          }
          y = y + 1;
          iVar6 = subAccess.m_size.m_data[1];
          iVar7 = subAccess.m_size.m_data[0];
          iVar4 = iVar5;
        } while (y < subAccess.m_size.m_data[0]);
      }
      z = z + 1;
    } while (z < iVar6);
    if (0 < iVar8) {
      iVar9 = iVar9 + 1;
      goto LAB_0164cb43;
    }
    if (iVar8 < 0) goto LAB_0164cb43;
  }
  iVar9 = iVar9 + 1;
LAB_0164cb43:
  bVar2 = numLines->m_data[0] <= iVar9;
  bVar3 = iVar9 <= numLines->m_data[1];
  if ((!bVar3 || !bVar2) &&
     (*messageLimitCounter = *messageLimitCounter + -1, -1 < *messageLimitCounter)) {
    if (area->m_data[2] == 1) {
      local_1b0._0_8_ =
           ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"On column ",10);
      std::ostream::operator<<(poVar1,area->m_data[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", y: [",6);
      std::ostream::operator<<(poVar1,area->m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
      std::ostream::operator<<(poVar1,area->m_data[3] + area->m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"):\n",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tExpected [",0xb);
      std::ostream::operator<<(poVar1,numLines->m_data[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::operator<<(poVar1,numLines->m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"] lines but the number of lines in the area is ",0x2f);
      std::ostream::operator<<(poVar1,iVar9);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_1b0._0_8_ =
           ((this->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
           m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"On row ",7);
      std::ostream::operator<<(poVar1,area->m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", x: [",6);
      std::ostream::operator<<(poVar1,area->m_data[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
      std::ostream::operator<<(poVar1,area->m_data[2] + area->m_data[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"):\n",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\tExpected [",0xb);
      std::ostream::operator<<(poVar1,numLines->m_data[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
      std::ostream::operator<<(poVar1,numLines->m_data[1]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"] lines but the number of lines in the area is ",0x2f);
      std::ostream::operator<<(poVar1,iVar9);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_138);
  }
  return bVar3 && bVar2;
}

Assistant:

bool LineRenderCase::checkAreaNumLines (const tcu::ConstPixelBufferAccess& access, const tcu::IVec4& area, int& messageLimitCounter, int componentNdx, const tcu::IVec2& numLines) const
{
	// Num maxima == num lines
	const tcu::ConstPixelBufferAccess	subAccess		= tcu::getSubregion(access, area.x(), area.y(), 0, area.z(), area.w(), 1);
	const tcu::IVec2					numMinimaMaxima	= getNumMinimaMaxima(subAccess, componentNdx);
	const int							numMaxima		= numMinimaMaxima.y();

	// In valid range
	if (numMaxima >= numLines.x() && numMaxima <= numLines.y())
		return true;

	if (--messageLimitCounter < 0)
		return false;

	if (area.z() == 1)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "On column " << area.x() << ", y: [" << area.y() << "," << (area.y()+area.w()) << "):\n"
				<< "\tExpected [" << numLines.x() << ", " << numLines.y() << "] lines but the number of lines in the area is " << numMaxima
			<< tcu::TestLog::EndMessage;
	else
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "On row " << area.y() << ", x: [" << area.x() << "," << (area.x()+area.z()) << "):\n"
				<< "\tExpected [" << numLines.x() << ", " << numLines.y() << "] lines but the number of lines in the area is " << numMaxima
			<< tcu::TestLog::EndMessage;

	return false;
}